

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O2

Matrix<double> * __thiscall
nnad::Matrix<double>::GetCofactor
          (Matrix<double> *__return_storage_ptr__,Matrix<double> *this,int p,int q)

{
  int iVar1;
  int iVar2;
  int i;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  string local_50;
  
  local_5c = this->_Lines;
  iVar1 = local_5c;
  if (local_5c != this->_Columns) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"GetCofactor: matrix must be square.",
               (allocator<char> *)&local_5c);
    Error(&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    iVar1 = this->_Lines;
    local_5c = this->_Columns;
  }
  local_50._M_dataplus._M_p._0_4_ = iVar1 + -1;
  local_5c = local_5c + -1;
  local_60 = -1;
  Matrix(__return_storage_ptr__,(int *)&local_50,&local_5c,&local_60);
  local_5c = 0;
  iVar1 = this->_Lines;
  iVar2 = 0;
  for (local_60 = 0; local_60 < iVar1; local_60 = local_60 + 1) {
    for (local_58 = 0; local_58 < this->_Columns; local_58 = local_58 + 1) {
      if ((local_58 != q) && (local_60 != p)) {
        local_54 = iVar2;
        local_50._M_dataplus._M_p = (pointer)GetElement(this,&local_60,&local_58);
        SetElement(__return_storage_ptr__,&local_5c,&local_54,(double *)&local_50);
        iVar1 = this->_Lines;
        if (iVar2 == iVar1 + -2) {
          local_5c = local_5c + 1;
          iVar2 = 0;
        }
        else {
          iVar2 = iVar2 + 1;
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix<T> GetCofactor(int p, int q)
    {
      if (_Lines != _Columns)
        Error("GetCofactor: matrix must be square.");

      Matrix<T> output{_Lines-1, _Columns-1};
      int i = 0, j = 0;

      // Looping for each element of the matrix
      for (int row = 0; row < _Lines; row++)
        for (int col = 0; col < _Columns; col++)
          // Copying into temporary matrix only those element which
          // are not in given row and column.
          if (row != p && col != q)
            {
              output.SetElement(i,j++,  this->GetElement(row,col));

              // Row is filled, so increase row index and reset col
              // index.
              if (j == _Lines - 1)
                {
                  j = 0;
                  i++;
                }
            }
      return output;
    }